

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O0

DdNode * BuildSubsetBdd(DdManager *dd,st__table *pathTable,DdNode *node,AssortedInfo *info,
                       st__table *subsetNodeTable)

{
  bool bVar1;
  int iVar2;
  uint i;
  ulong uVar3;
  int local_100;
  uint local_fc;
  DdHalfWord local_f8;
  uint local_f4;
  int elseDone;
  int thenDone;
  int processingDone;
  int tiebreakChild;
  uint NnvBotDist;
  uint NvBotDist;
  uint NvPathLength;
  uint NnvPathLength;
  uint evenLen;
  uint oddLen;
  uint childPathLength;
  uint topid;
  char *entry;
  DdNode *regNew;
  DdNode *topv;
  DdNode *neW;
  NodeDist_t *nodeStatNnv;
  NodeDist_t *nodeStat;
  NodeDist_t *nodeStatNv;
  DdNode *regNv;
  DdNode *regNnv;
  DdNode *regChild;
  DdNode *child;
  DdNode *childBranch;
  DdNode *ElseBranch;
  DdNode *ThenBranch;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  st__table *subsetNodeTable_local;
  AssortedInfo *info_local;
  DdNode *node_local;
  st__table *pathTable_local;
  DdManager *dd_local;
  
  regNv = (DdNode *)0x0;
  nodeStatNv = (NodeDist_t *)0x0;
  NvBotDist = 0;
  NnvBotDist = 0;
  dd_local = (DdManager *)node;
  if (*(int *)((ulong)node & 0xfffffffffffffffe) != 0x7fffffff) {
    Nv = (DdNode *)((ulong)node & 0xfffffffffffffffe);
    N = (DdNode *)subsetNodeTable;
    subsetNodeTable_local = (st__table *)info;
    info_local = (AssortedInfo *)node;
    node_local = (DdNode *)pathTable;
    pathTable_local = (st__table *)dd;
    iVar2 = st__lookup(pathTable,(char *)Nv,(char **)&nodeStatNnv);
    if (iVar2 == 0) {
      fprintf((FILE *)pathTable_local[0xc].bins,"Something wrong, node must be in table \n");
      *(undefined4 *)&pathTable_local[0xd].compare = 5;
      dd_local = (DdManager *)0x0;
    }
    else {
      if (((ulong)info_local & 1) == 0) {
        if (nodeStatNnv->regResult != (DdNode *)0x0) {
          return nodeStatNnv->regResult;
        }
      }
      else if (nodeStatNnv->compResult != (DdNode *)0x0) {
        return nodeStatNnv->compResult;
      }
      Nnv = (DdNode *)
            (*(ulong *)(((ulong)Nv & 0xfffffffffffffffe) + 0x10) ^ (long)(int)((uint)info_local & 1)
            );
      ThenBranch = (DdNode *)
                   (*(ulong *)(((ulong)Nv & 0xfffffffffffffffe) + 0x18) ^
                   (long)(int)((uint)info_local & 1));
      elseDone = 0;
      bVar1 = false;
      ElseBranch = (DdNode *)0x0;
      childBranch = (DdNode *)0x0;
      if (*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) {
        if ((Nnv == (DdNode *)pathTable_local->bins) &&
           (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0)) {
          *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
        }
        *(int *)(((ulong)Nnv & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)Nnv & 0xfffffffffffffffe) + 4) + 1;
        if (Nnv == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        bVar1 = true;
        elseDone = 1;
        tiebreakChild = -1;
        ElseBranch = Nnv;
      }
      else {
        nodeStatNv = (NodeDist_t *)((ulong)Nnv & 0xfffffffffffffffe);
        iVar2 = st__lookup((st__table *)node_local,(char *)nodeStatNv,(char **)&nodeStat);
        if (iVar2 == 0) {
          fprintf((FILE *)pathTable_local[0xc].bins,"Something wrong, node must be in table\n");
          *(undefined4 *)&pathTable_local[0xd].compare = 5;
          return (DdNode *)0x0;
        }
        if ((nodeStat->oddTopDist == 0xffffffff) || (nodeStat->oddBotDist == 0xffffffff)) {
          NnvPathLength = 0xffffffff;
        }
        else {
          NnvPathLength = nodeStat->oddTopDist + nodeStat->oddBotDist;
        }
        if ((nodeStat->evenTopDist == 0xffffffff) || (nodeStat->evenBotDist == 0xffffffff)) {
          NvPathLength = 0xffffffff;
        }
        else {
          NvPathLength = nodeStat->evenTopDist + nodeStat->evenBotDist;
        }
        if (NvPathLength < NnvPathLength) {
          local_f4 = NvPathLength;
        }
        else {
          local_f4 = NnvPathLength;
        }
        NnvBotDist = local_f4;
        if (NvPathLength < NnvPathLength) {
          local_f8 = nodeStat->evenBotDist;
        }
        else {
          local_f8 = nodeStat->oddBotDist;
        }
        tiebreakChild = local_f8;
      }
      if (*(int *)((ulong)ThenBranch & 0xfffffffffffffffe) == 0x7fffffff) {
        if ((ThenBranch == (DdNode *)pathTable_local->bins) &&
           (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0)) {
          *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
        }
        childBranch = ThenBranch;
        *(int *)(((ulong)ThenBranch & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)ThenBranch & 0xfffffffffffffffe) + 4) + 1;
        if (ThenBranch == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        elseDone = elseDone + 1;
        processingDone = -1;
      }
      else {
        regNv = (DdNode *)((ulong)ThenBranch & 0xfffffffffffffffe);
        iVar2 = st__lookup((st__table *)node_local,(char *)regNv,(char **)&neW);
        if (iVar2 == 0) {
          fprintf((FILE *)pathTable_local[0xc].bins,"Something wrong, node must be in table\n");
          *(undefined4 *)&pathTable_local[0xd].compare = 5;
          return (DdNode *)0x0;
        }
        if ((neW->index == 0xffffffff) || (*(int *)&neW->next == -1)) {
          NnvPathLength = 0xffffffff;
        }
        else {
          NnvPathLength = neW->index + *(int *)&neW->next;
        }
        if ((neW->ref == 0xffffffff) || (*(int *)((long)&neW->next + 4) == -1)) {
          NvPathLength = 0xffffffff;
        }
        else {
          NvPathLength = neW->ref + *(int *)((long)&neW->next + 4);
        }
        if (NvPathLength < NnvPathLength) {
          local_fc = NvPathLength;
        }
        else {
          local_fc = NnvPathLength;
        }
        NvBotDist = local_fc;
        if (NvPathLength < NnvPathLength) {
          local_100 = *(int *)((long)&neW->next + 4);
        }
        else {
          local_100 = *(int *)&neW->next;
        }
        processingDone = local_100;
      }
      for (; elseDone != 2; elseDone = elseDone + 1) {
        if (elseDone == 0) {
          if ((NnvBotDist < NvBotDist) ||
             ((NnvBotDist == NvBotDist && ((uint)tiebreakChild <= (uint)processingDone)))) {
            regChild = Nnv;
            regNnv = (DdNode *)nodeStatNv;
            bVar1 = true;
            evenLen = NnvBotDist;
          }
          else {
            regChild = ThenBranch;
            regNnv = regNv;
            evenLen = NvBotDist;
          }
        }
        else if (bVar1) {
          regChild = ThenBranch;
          regNnv = regNv;
          evenLen = NvBotDist;
        }
        else {
          regChild = Nnv;
          regNnv = (DdNode *)nodeStatNv;
          bVar1 = true;
          evenLen = NnvBotDist;
        }
        if (*(uint *)&subsetNodeTable_local->compare < evenLen) {
          child = zero;
        }
        else if (evenLen < *(uint *)&subsetNodeTable_local->compare) {
          if (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0) {
            *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
          }
          child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,regChild,
                                 (AssortedInfo *)subsetNodeTable_local,(st__table *)N);
        }
        else {
          iVar2 = st__lookup(*(st__table **)&subsetNodeTable_local->num_bins,(char *)regNnv,
                             (char **)&childPathLength);
          if (iVar2 == 0) {
            if (*(int *)&subsetNodeTable_local->hash < 1) {
              if (*(int *)((long)&subsetNodeTable_local->compare + 4) == 0) {
                child = zero;
              }
              else {
                iVar2 = st__insert(*(st__table **)&subsetNodeTable_local->num_bins,(char *)regNnv,
                                   (char *)0x0);
                if (iVar2 == -10000) {
                  memOut = 1;
                  fprintf((FILE *)pathTable_local[0xc].bins,"OUT of memory\n");
                  *(undefined4 *)&subsetNodeTable_local->hash = 0;
                  child = zero;
                }
                else {
                  *(int *)&subsetNodeTable_local->hash = *(int *)&subsetNodeTable_local->hash + -1;
                  child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,
                                         regChild,(AssortedInfo *)subsetNodeTable_local,
                                         (st__table *)N);
                }
              }
            }
            else {
              iVar2 = st__insert(*(st__table **)&subsetNodeTable_local->num_bins,(char *)regNnv,
                                 (char *)0x0);
              if (iVar2 == -10000) {
                memOut = 1;
                fprintf((FILE *)pathTable_local[0xc].bins,"OUT of memory\n");
                *(undefined4 *)&subsetNodeTable_local->hash = 0;
                child = zero;
              }
              else {
                *(int *)&subsetNodeTable_local->hash = *(int *)&subsetNodeTable_local->hash + -1;
                if (*(int *)&subsetNodeTable_local->hash < 1) {
                  *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 1;
                }
                child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,regChild
                                       ,(AssortedInfo *)subsetNodeTable_local,(st__table *)N);
              }
            }
          }
          else {
            if (*(int *)((long)&subsetNodeTable_local->compare + 4) != 0) {
              *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
            }
            child = BuildSubsetBdd((DdManager *)pathTable_local,(st__table *)node_local,regChild,
                                   (AssortedInfo *)subsetNodeTable_local,(st__table *)N);
          }
        }
        if (child == (DdNode *)0x0) {
          if (ElseBranch != (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)pathTable_local,ElseBranch);
            ElseBranch = (DdNode *)0x0;
          }
          if (childBranch != (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)pathTable_local,childBranch);
          }
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)child & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)child & 0xfffffffffffffffe) + 4) + 1;
        if (regChild == Nnv) {
          ElseBranch = child;
        }
        else {
          childBranch = child;
        }
      }
      *(undefined4 *)((long)&subsetNodeTable_local->compare + 4) = 0;
      i = Cudd_NodeReadIndex(Nv);
      regNew = Cudd_ReadVars((DdManager *)pathTable_local,i);
      *(int *)(((ulong)regNew & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)regNew & 0xfffffffffffffffe) + 4) + 1;
      topv = cuddBddIteRecur((DdManager *)pathTable_local,regNew,ElseBranch,childBranch);
      if (topv != (DdNode *)0x0) {
        *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) + 1;
      }
      Cudd_RecursiveDeref((DdManager *)pathTable_local,regNew);
      Cudd_RecursiveDeref((DdManager *)pathTable_local,ElseBranch);
      Cudd_RecursiveDeref((DdManager *)pathTable_local,childBranch);
      if (N != (DdNode *)0x0) {
        entry = (char *)((ulong)topv & 0xfffffffffffffffe);
        iVar2 = st__lookup((st__table *)N,entry,(char **)&childPathLength);
        if ((iVar2 == 0) && (*(int *)((ulong)entry & 0xfffffffffffffffe) != 0x7fffffff)) {
          iVar2 = st__insert((st__table *)N,entry,(char *)0x0);
          if (iVar2 == -10000) {
            fprintf((FILE *)pathTable_local[0xc].bins,"Out of memory\n");
            return (DdNode *)0x0;
          }
          if (subsetNodeTable_local->max_density < *(int *)((long)&N->type + 4)) {
            *(undefined4 *)&subsetNodeTable_local->hash = 0;
          }
        }
      }
      if (topv == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        if (((ulong)info_local & 1) == 0) {
          nodeStatNnv->regResult = topv;
          uVar3 = (ulong)nodeStatNnv->regResult & 0xfffffffffffffffe;
          *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          if (topv == (DdNode *)info_local) {
            if (nodeStatNnv->compResult != (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)pathTable_local,nodeStatNnv->compResult);
            }
            nodeStatNnv->compResult = (DdNode *)((ulong)topv ^ 1);
            uVar3 = (ulong)nodeStatNnv->compResult & 0xfffffffffffffffe;
            *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          }
        }
        else {
          nodeStatNnv->compResult = topv;
          uVar3 = (ulong)nodeStatNnv->compResult & 0xfffffffffffffffe;
          *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          if (topv == (DdNode *)info_local) {
            if (nodeStatNnv->regResult != (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)pathTable_local,nodeStatNnv->regResult);
            }
            nodeStatNnv->regResult = (DdNode *)((ulong)topv ^ 1);
            uVar3 = (ulong)nodeStatNnv->regResult & 0xfffffffffffffffe;
            *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
          }
        }
        *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)topv;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
BuildSubsetBdd(
  DdManager * dd /* DD manager */,
  st__table * pathTable /* path table with path lengths and computed results */,
  DdNode * node /* current node */,
  struct AssortedInfo * info /* assorted information structure */,
  st__table * subsetNodeTable /* table storing computed results */)
{
    DdNode *N, *Nv, *Nnv;
    DdNode *ThenBranch, *ElseBranch, *childBranch;
    DdNode *child, *regChild, *regNnv = NULL, *regNv = NULL;
    NodeDist_t *nodeStatNv, *nodeStat, *nodeStatNnv;
    DdNode *neW, *topv, *regNew;
    char *entry;
    unsigned int topid;
    unsigned int childPathLength, oddLen, evenLen, NnvPathLength = 0, NvPathLength = 0;
    unsigned int NvBotDist, NnvBotDist;
    int tiebreakChild;
    int  processingDone, thenDone, elseDone;


#ifdef DD_DEBUG
    numCalls++;
#endif
    if (Cudd_IsConstant(node))
        return(node);

    N = Cudd_Regular(node);
    /* Find node in table. */
    if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
        (void) fprintf(dd->err, "Something wrong, node must be in table \n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }
    /* If the node in the table has been visited, then return the corresponding
    ** Dd. Since a node can become a subset of itself, its
    ** complement (that is te same node reached by a different parity) will
    ** become a superset of the original node and result in some minterms
    ** that were not in the original set. Hence two different results are
    ** maintained, corresponding to the odd and even parities.
    */

    /* If this node is reached with an odd parity, get odd parity results. */
    if (Cudd_IsComplement(node)) {
        if  (nodeStat->compResult != NULL) {
#ifdef DD_DEBUG
            hits++;
#endif
            return(nodeStat->compResult);
        }
    } else {
        /* if this node is reached with an even parity, get even parity
         * results
         */
        if (nodeStat->regResult != NULL) {
#ifdef DD_DEBUG
            hits++;
#endif
            return(nodeStat->regResult);
        }
    }


    /* get children */
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* no child processed */
    processingDone = 0;
    /* then child not processed */
    thenDone = 0;
    ThenBranch = NULL;
    /* else child not processed */
    elseDone = 0;
    ElseBranch = NULL;
    /* if then child constant, branch is the child */
    if (Cudd_IsConstant(Nv)) {
        /*shortest path found */
        if ((Nv == DD_ONE(dd)) && (info->findShortestPath)) {
            info->findShortestPath = 0;
        }

        ThenBranch = Nv;
        cuddRef(ThenBranch);
        if (ThenBranch == NULL) {
            return(NULL);
        }

        thenDone++;
        processingDone++;
        NvBotDist = MAXSHORTINT;
    } else {
        /* Derive regular child for table lookup. */
        regNv = Cudd_Regular(Nv);
        /* Get node data for shortest path length. */
        if (! st__lookup(pathTable, (const char *)regNv, (char **)&nodeStatNv) ) {
            (void) fprintf(dd->err, "Something wrong, node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        /* Derive shortest path length for child. */
        if ((nodeStatNv->oddTopDist != MAXSHORTINT) &&
            (nodeStatNv->oddBotDist != MAXSHORTINT)) {
            oddLen = (nodeStatNv->oddTopDist + nodeStatNv->oddBotDist);
        } else {
            oddLen = MAXSHORTINT;
        }

        if ((nodeStatNv->evenTopDist != MAXSHORTINT) &&
            (nodeStatNv->evenBotDist != MAXSHORTINT)) {
            evenLen = (nodeStatNv->evenTopDist +nodeStatNv->evenBotDist);
        } else {
            evenLen = MAXSHORTINT;
        }

        NvPathLength = (oddLen <= evenLen) ? oddLen : evenLen;
        NvBotDist = (oddLen <= evenLen) ? nodeStatNv->oddBotDist:
                                                   nodeStatNv->evenBotDist;
    }
    /* if else child constant, branch is the child */
    if (Cudd_IsConstant(Nnv)) {
        /*shortest path found */
        if ((Nnv == DD_ONE(dd)) && (info->findShortestPath)) {
            info->findShortestPath = 0;
        }

        ElseBranch = Nnv;
        cuddRef(ElseBranch);
        if (ElseBranch == NULL) {
            return(NULL);
        }

        elseDone++;
        processingDone++;
        NnvBotDist = MAXSHORTINT;
    } else {
        /* Derive regular child for table lookup. */
        regNnv = Cudd_Regular(Nnv);
        /* Get node data for shortest path length. */
        if (! st__lookup(pathTable, (const char *)regNnv, (char **)&nodeStatNnv) ) {
            (void) fprintf(dd->err, "Something wrong, node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        /* Derive shortest path length for child. */
        if ((nodeStatNnv->oddTopDist != MAXSHORTINT) &&
            (nodeStatNnv->oddBotDist != MAXSHORTINT)) {
            oddLen = (nodeStatNnv->oddTopDist + nodeStatNnv->oddBotDist);
        } else {
            oddLen = MAXSHORTINT;
        }

        if ((nodeStatNnv->evenTopDist != MAXSHORTINT) &&
            (nodeStatNnv->evenBotDist != MAXSHORTINT)) {
            evenLen = (nodeStatNnv->evenTopDist +nodeStatNnv->evenBotDist);
        } else {
            evenLen = MAXSHORTINT;
        }

        NnvPathLength = (oddLen <= evenLen) ? oddLen : evenLen;
        NnvBotDist = (oddLen <= evenLen) ? nodeStatNnv->oddBotDist :
                                                   nodeStatNnv->evenBotDist;
    }

    tiebreakChild = (NvBotDist <= NnvBotDist) ? 1 : 0;
    /* while both children not processed */
    while (processingDone != 2) {
        if (!processingDone) {
            /* if no child processed */
            /* pick the child with shortest path length and record which one
             * picked
             */
            if ((NvPathLength < NnvPathLength) ||
                ((NvPathLength == NnvPathLength) && (tiebreakChild == 1))) {
                child = Nv;
                regChild = regNv;
                thenDone = 1;
                childPathLength = NvPathLength;
            } else {
                child = Nnv;
                regChild = regNnv;
                elseDone = 1;
                childPathLength = NnvPathLength;
            } /* then path length less than else path length */
        } else {
            /* if one child processed, process the other */
            if (thenDone) {
                child = Nnv;
                regChild = regNnv;
                elseDone = 1;
                childPathLength = NnvPathLength;
            } else {
                child = Nv;
                regChild = regNv;
                thenDone = 1;
                childPathLength = NvPathLength;
            } /* end of else pick the Then child if ELSE child processed */
        } /* end of else one child has been processed */

        /* ignore (replace with constant 0) all nodes which lie on paths larger
         * than the maximum length of the path required
         */
        if (childPathLength > info->maxpath) {
            /* record nodes visited */
            childBranch = zero;
        } else {
            if (childPathLength < info->maxpath) {
                if (info->findShortestPath) {
                    info->findShortestPath = 0;
                }
                childBranch = BuildSubsetBdd(dd, pathTable, child, info,
                                             subsetNodeTable);

            } else { /* Case: path length of node = maxpath */
                /* If the node labeled with maxpath is found in the
                ** maxpathTable, use it to build the subset BDD.  */
                if ( st__lookup(info->maxpathTable, (char *)regChild,
                              (char **)&entry)) {
                    /* When a node that is already been chosen is hit,
                    ** the quest for a complete path is over.  */
                    if (info->findShortestPath) {
                        info->findShortestPath = 0;
                    }
                    childBranch = BuildSubsetBdd(dd, pathTable, child, info,
                                                 subsetNodeTable);
                } else {
                    /* If node is not found in the maxpathTable and
                    ** the threshold has been reached, then if the
                    ** path needs to be completed, continue. Else
                    ** replace the node with a zero.  */
                    if (info->thresholdReached <= 0) {
                        if (info->findShortestPath) {
                            if ( st__insert(info->maxpathTable, (char *)regChild,
                                          (char *)NIL(char)) == st__OUT_OF_MEM) {
                                memOut = 1;
                                (void) fprintf(dd->err, "OUT of memory\n");
                                info->thresholdReached = 0;
                                childBranch = zero;
                            } else {
                                info->thresholdReached--;
                                childBranch = BuildSubsetBdd(dd, pathTable,
                                                    child, info,subsetNodeTable);
                            }
                        } else { /* not find shortest path, we dont need this
                                    node */
                            childBranch = zero;
                        }
                    } else { /* Threshold hasn't been reached,
                             ** need the node. */
                        if ( st__insert(info->maxpathTable, (char *)regChild,
                                      (char *)NIL(char)) == st__OUT_OF_MEM) {
                            memOut = 1;
                            (void) fprintf(dd->err, "OUT of memory\n");
                            info->thresholdReached = 0;
                            childBranch = zero;
                        } else {
                            info->thresholdReached--;
                            if (info->thresholdReached <= 0) {
                                info->findShortestPath = 1;
                            }
                            childBranch = BuildSubsetBdd(dd, pathTable,
                                                 child, info, subsetNodeTable);

                        } /* end of st__insert successful */
                    } /* end of threshold hasnt been reached yet */
                } /* end of else node not found in maxpath table */
            } /* end of if (path length of node = maxpath) */
        } /* end if !(childPathLength > maxpath) */
        if (childBranch == NULL) {
            /* deref other stuff incase reordering has taken place */
            if (ThenBranch != NULL) {
                Cudd_RecursiveDeref(dd, ThenBranch);
                ThenBranch = NULL;
            }
            if (ElseBranch != NULL) {
                Cudd_RecursiveDeref(dd, ElseBranch);
                ElseBranch = NULL;
            }
            return(NULL);
        }

        cuddRef(childBranch);

        if (child == Nv) {
            ThenBranch = childBranch;
        } else {
            ElseBranch = childBranch;
        }
        processingDone++;

    } /*end of while processing Nv, Nnv */

    info->findShortestPath = 0;
    topid = Cudd_NodeReadIndex(N);
    topv = Cudd_ReadVars(dd, topid);
    cuddRef(topv);
    neW = cuddBddIteRecur(dd, topv, ThenBranch, ElseBranch);
    if (neW != NULL) {
        cuddRef(neW);
    }
    Cudd_RecursiveDeref(dd, topv);
    Cudd_RecursiveDeref(dd, ThenBranch);
    Cudd_RecursiveDeref(dd, ElseBranch);


    /* Hard Limit of threshold has been imposed */
    if (subsetNodeTable != NIL( st__table)) {
        /* check if a new node is created */
        regNew = Cudd_Regular(neW);
        /* subset node table keeps all new nodes that have been created to keep
         * a running count of how many nodes have been built in the subset.
         */
        if (! st__lookup(subsetNodeTable, (char *)regNew, (char **)&entry)) {
            if (!Cudd_IsConstant(regNew)) {
                if ( st__insert(subsetNodeTable, (char *)regNew,
                              (char *)NULL) == st__OUT_OF_MEM) {
                    (void) fprintf(dd->err, "Out of memory\n");
                    return (NULL);
                }
                if ( st__count(subsetNodeTable) > info->threshold) {
                    info->thresholdReached = 0;
                }
            }
        }
    }


    if (neW == NULL) {
        return(NULL);
    } else {
        /*store computed result in regular form*/
        if (Cudd_IsComplement(node)) {
            nodeStat->compResult = neW;
            cuddRef(nodeStat->compResult);
            /* if the new node is the same as the corresponding node in the
             * original bdd then its complement need not be computed as it
             * cannot be larger than the node itself
             */
            if (neW == node) {
#ifdef DD_DEBUG
                thishit++;
#endif
                /* if a result for the node has already been computed, then
                 * it can only be smaller than teh node itself. hence store
                 * the node result in order not to break recombination
                 */
                if (nodeStat->regResult != NULL) {
                    Cudd_RecursiveDeref(dd, nodeStat->regResult);
                }
                nodeStat->regResult = Cudd_Not(neW);
                cuddRef(nodeStat->regResult);
            }

        } else {
            nodeStat->regResult = neW;
            cuddRef(nodeStat->regResult);
            if (neW == node) {
#ifdef DD_DEBUG
                thishit++;
#endif
                if (nodeStat->compResult != NULL) {
                    Cudd_RecursiveDeref(dd, nodeStat->compResult);
                }
                nodeStat->compResult = Cudd_Not(neW);
                cuddRef(nodeStat->compResult);
            }
        }

        cuddDeref(neW);
        return(neW);
    } /* end of else i.e. Subset != NULL */
}